

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.h
# Opt level: O0

void __thiscall OutputContext::Print(OutputContext *this,char *str,uint length)

{
  uint uVar1;
  uint uVar2;
  uint remainder;
  uint length_local;
  char *str_local;
  OutputContext *this_local;
  
  if (this->outputBufPos + length < this->outputBufSize) {
    memcpy(this->outputBuf + this->outputBufPos,str,(ulong)length);
    this->outputBufPos = length + this->outputBufPos;
  }
  else {
    uVar2 = this->outputBufSize - this->outputBufPos;
    memcpy(this->outputBuf + this->outputBufPos,str,(ulong)uVar2);
    this->outputBufPos = uVar2 + this->outputBufPos;
    (*this->writeStream)(this->stream,this->outputBuf,this->outputBufPos);
    this->outputBufPos = 0;
    uVar1 = length - uVar2;
    if (uVar1 != 0) {
      if (uVar1 < this->outputBufSize) {
        memcpy(this->outputBuf + this->outputBufPos,str + uVar2,(ulong)uVar1);
        this->outputBufPos = uVar1 + this->outputBufPos;
      }
      else {
        (*this->writeStream)(this->stream,str + uVar2,uVar1);
      }
    }
  }
  return;
}

Assistant:

void Print(const char *str, unsigned length)
	{
		if(outputBufPos + length < outputBufSize)
		{
			memcpy(outputBuf + outputBufPos, str, length);
			outputBufPos += length;
		}
		else
		{
			unsigned remainder = outputBufSize - outputBufPos;

			memcpy(outputBuf + outputBufPos, str, remainder);
			outputBufPos += remainder;

			writeStream(stream, outputBuf, outputBufPos);
			outputBufPos = 0;

			str += remainder;
			length -= remainder;

			if(!length)
				return;

			if(length < outputBufSize)
			{
				memcpy(outputBuf + outputBufPos, str, length);
				outputBufPos += length;
			}
			else
			{
				writeStream(stream, str, length);
			}
		}
	}